

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntelligentKeyboard.cpp
# Opt level: O0

void __thiscall Atari::ST::IntelligentKeyboard::set_button_pressed(IntelligentKeyboard *this)

{
  byte in_DL;
  int in_ESI;
  
  set_button_pressed((IntelligentKeyboard *)&this[-1].joysticks_,in_ESI,(bool)(in_DL & 1));
  return;
}

Assistant:

void IntelligentKeyboard::set_button_pressed(int index, bool is_pressed) {
	index ^= 1;		// The primary button is b1; the secondary is b0.

	const auto mask = 1 << index;
	const auto event_mask = 1 << (index << 1);
	if(is_pressed) {
		mouse_button_state_ |= mask;
		mouse_button_events_ |= event_mask;
	} else {
		mouse_button_state_ &= ~mask;
		mouse_button_events_ |= event_mask << 1;
	}
}